

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.c
# Opt level: O0

int chain_segment_mix(mixed_segment *segment)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  mixed_segment *segment_1;
  uint32_t i;
  uint32_t count;
  vector *data;
  mixed_segment *segment_local;
  
  plVar2 = (long *)segment->data;
  uVar1 = *(uint *)(plVar2 + 1);
  segment_1._0_4_ = 0;
  while( true ) {
    if (uVar1 <= (uint)segment_1) {
      return 1;
    }
    lVar3 = *(long *)(*plVar2 + (ulong)(uint)segment_1 * 8);
    if ((*(long *)(lVar3 + 0x18) != 0) && (iVar4 = (**(code **)(lVar3 + 0x18))(lVar3), iVar4 == 0))
    break;
    segment_1._0_4_ = (uint)segment_1 + 1;
  }
  return 0;
}

Assistant:

int chain_segment_mix(struct mixed_segment *segment){
  struct vector *data = (struct vector *)segment->data;
  uint32_t count = data->count;
  for(uint32_t i=0; i<count; ++i){
    struct mixed_segment *segment = (struct mixed_segment *)data->data[i];
    if(segment->mix){
      if(!segment->mix(segment)){
        return 0;
      }
    }
  }
  return 1;
}